

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O0

void RDL_printGraph(RDL_graph *graph)

{
  uint local_18;
  uint local_14;
  uint j;
  uint i;
  RDL_graph *graph_local;
  
  printf("|V|=%d, |E|=%d\n",(ulong)graph->V,(ulong)graph->E);
  for (local_14 = 0; local_14 < graph->V; local_14 = local_14 + 1) {
    printf("%d:  ",(ulong)local_14);
    for (local_18 = 0; local_18 < graph->degree[local_14]; local_18 = local_18 + 1) {
      printf("%d ",(ulong)graph->adjList[local_14][local_18][0]);
    }
    printf("\n");
  }
  if (graph->edges != (uint **)0x0) {
    printf("edges:\n");
    for (local_14 = 0; local_14 < graph->E; local_14 = local_14 + 1) {
      printf("%d: [%d,%d]\n",(ulong)local_14,(ulong)*graph->edges[local_14],
             (ulong)graph->edges[local_14][1]);
    }
  }
  return;
}

Assistant:

void RDL_printGraph(const RDL_graph *graph)
{
  unsigned i,j;

  printf("|V|=%d, |E|=%d\n",graph->V,graph->E);
  for(i=0; i<graph->V; ++i)
  {
    printf("%d:  ",i);
    for(j=0; j<graph->degree[i]; ++j)
    {
      printf("%d ",graph->adjList[i][j][0]);
    }
    printf("\n");
  }
  if(graph->edges)/*undirected*/
  {
    printf("edges:\n");
    for(i=0; i<graph->E; ++i)
    {
      printf("%d: [%d,%d]\n", i, graph->edges[i][0], graph->edges[i][1]);
    }
  }
}